

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcGeometryShaderInput.cpp
# Opt level: O0

int __thiscall
glcts::GeometryShader_gl_in_ArrayLengthTest::init
          (GeometryShader_gl_in_ArrayLengthTest *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  int extraout_EAX;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  reference ppCVar5;
  Case *test;
  undefined1 local_88 [8];
  iterator it;
  value_type local_60;
  value_type local_58;
  value_type local_50;
  value_type local_48;
  value_type local_40;
  value_type local_38;
  long local_30;
  Functions *gl;
  char *local_18;
  char *captured_varyings [1];
  GeometryShader_gl_in_ArrayLengthTest *this_local;
  
  captured_varyings[0] = (char *)this;
  TestCaseBase::init(&this->super_TestCaseBase,ctx);
  local_18 = "in_array_size";
  if (((this->super_TestCaseBase).m_is_geometry_shader_extension_supported & 1U) != 1) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    tcu::NotSupportedError::NotSupportedError
              (this_00,"Geometry shader functionality not supported, skipping","",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
               ,0x243);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_30 = CONCAT44(extraout_var,iVar2);
  initCase(this,&this->m_test_lines,1,2,2,0,"layout(lines)                      in;\n",
           "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n");
  local_38 = &this->m_test_lines;
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::push_back(&this->m_tests,&local_38);
  initCase(this,&this->m_test_lines_adjacency,
           (this->super_TestCaseBase).m_glExtTokens.LINES_ADJACENCY,4,4,0,
           "layout(lines_adjacency)            in;\n",
           "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n");
  local_40 = &this->m_test_lines_adjacency;
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::push_back(&this->m_tests,&local_40);
  initCase(this,&this->m_test_points,0,1,1,0,"layout(points)                     in;\n",
           "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n");
  local_48 = &this->m_test_points;
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::push_back(&this->m_tests,&local_48);
  initCase(this,&this->m_test_triangles,4,3,3,0,"layout(triangles)                  in;\n",
           "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n");
  local_50 = &this->m_test_triangles;
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::push_back(&this->m_tests,&local_50);
  initCase(this,&this->m_test_triangles_adjacency,
           (this->super_TestCaseBase).m_glExtTokens.TRIANGLE_STRIP_ADJACENCY,6,6,0,
           "layout(triangles_adjacency)        in;\n",
           "layout(points, max_vertices=1)     out;\n\n#define N_OUT_VERTICES (1)\n");
  local_58 = &this->m_test_triangles_adjacency;
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::push_back(&this->m_tests,&local_58);
  initCase(this,&this->m_test_lines_adjacency_to_line_strip,
           (this->super_TestCaseBase).m_glExtTokens.LINES_ADJACENCY,4,4,1,
           "layout(lines_adjacency)            in;\n",
           "layout(line_strip, max_vertices=2) out;\n\n#define N_OUT_VERTICES (2)\n");
  local_60 = &this->m_test_lines_adjacency_to_line_strip;
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::push_back(&this->m_tests,&local_60);
  initCase(this,&this->m_test_triangles_adjacency_to_triangle_strip,
           (this->super_TestCaseBase).m_glExtTokens.TRIANGLE_STRIP_ADJACENCY,6,6,4,
           "layout(triangles_adjacency)        in;\n",
           "layout(triangle_strip, max_vertices=3) out;\n\n#define N_OUT_VERTICES (3)\n");
  it._M_node = (_Map_pointer)&this->m_test_triangles_adjacency_to_triangle_strip;
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::push_back(&this->m_tests,(value_type *)&it._M_node);
  std::
  deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
  ::begin((iterator *)local_88,&this->m_tests);
  while( true ) {
    std::
    deque<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_std::allocator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*>_>
    ::end((iterator *)&test,&this->m_tests);
    bVar1 = std::operator!=((_Self *)local_88,(_Self *)&test);
    if (!bVar1) break;
    ppCVar5 = std::
              _Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
              ::operator*((_Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
                           *)local_88);
    initCaseProgram(this,*ppCVar5,&local_18,1);
    std::
    _Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
    ::operator++((_Deque_iterator<glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_*&,_glcts::GeometryShader_gl_in_ArrayLengthTest::Case_**>
                  *)local_88);
  }
  (**(code **)(local_30 + 0x6c8))(1,&this->m_buffer_object_id);
  (**(code **)(local_30 + 0x40))(0x8892,this->m_buffer_object_id);
  (**(code **)(local_30 + 0x150))(0x8892,0x18,0,0x88e4);
  dVar3 = (**(code **)(local_30 + 0x800))();
  glu::checkError(dVar3,"Could not create buffer object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x283);
  (**(code **)(local_30 + 0x708))(1,&this->m_vertex_array_object_id);
  (**(code **)(local_30 + 0xd8))(this->m_vertex_array_object_id);
  dVar3 = (**(code **)(local_30 + 0x800))();
  glu::checkError(dVar3,"Could not create vertex array object",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/geometry_shader/esextcGeometryShaderInput.cpp"
                  ,0x289);
  return extraout_EAX;
}

Assistant:

void GeometryShader_gl_in_ArrayLengthTest::init()
{
	/* Initialize Base */
	TestCaseBase::init();

	/* Captured variables */
	const char* captured_varyings[] = { "in_array_size" };

	/* This test should only run if EXT_geometry_shader is supported */
	if (true != m_is_geometry_shader_extension_supported)
	{
		throw tcu::NotSupportedError(GEOMETRY_SHADER_EXTENSION_NOT_SUPPORTED, "", __FILE__, __LINE__);
	}

	/* GL */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Set up test descriptors */
	initCase(m_test_lines, GL_LINES, 2, /* number of vertices */
			 2,							/* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_lines, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_lines);

	initCase(m_test_lines_adjacency, m_glExtTokens.LINES_ADJACENCY, 4, /* number of vertices */
			 4,														   /* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_lines_with_adjacency, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_lines_adjacency);

	initCase(m_test_points, GL_POINTS, 1, /* number of vertices */
			 1,							  /* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_points, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_points);

	initCase(m_test_triangles, GL_TRIANGLES, 3, /* number of vertices */
			 3,									/* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_triangles, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_triangles);

	initCase(m_test_triangles_adjacency, m_glExtTokens.TRIANGLE_STRIP_ADJACENCY, 6, /* number of vertices */
			 6,																		/* as per spec */
			 GL_POINTS, m_geometry_shader_code_input_triangles_with_adjacency, m_geometry_shader_code_output_points);

	m_tests.push_back(&m_test_triangles_adjacency);

	initCase(m_test_lines_adjacency_to_line_strip, m_glExtTokens.LINES_ADJACENCY, 4 /* number of vertices */,
			 4 /* expected array length */, GL_LINES, m_geometry_shader_code_input_lines_with_adjacency,
			 m_geometry_shader_code_output_line_strip);

	m_tests.push_back(&m_test_lines_adjacency_to_line_strip);

	initCase(m_test_triangles_adjacency_to_triangle_strip, m_glExtTokens.TRIANGLE_STRIP_ADJACENCY,
			 6 /* number of vertices */, 6 /* expected array length */, GL_TRIANGLES,
			 m_geometry_shader_code_input_triangles_with_adjacency, m_geometry_shader_code_output_triangle_strip);

	m_tests.push_back(&m_test_triangles_adjacency_to_triangle_strip);

	/* Initialize program objects */
	for (testContainer::iterator it = m_tests.begin(); it != m_tests.end(); ++it)
	{
		/* Case instance */
		Case* test = *it;

		/* Init program */
		initCaseProgram(*test, captured_varyings, sizeof(captured_varyings) / sizeof(captured_varyings[0]));
	}

	/* Generate, bind and allocate buffer */
	gl.genBuffers(1, &m_buffer_object_id);
	gl.bindBuffer(GL_ARRAY_BUFFER, m_buffer_object_id);
	gl.bufferData(GL_ARRAY_BUFFER, m_buffer_size, 0 /* no start data */, GL_STATIC_DRAW);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create buffer object");

	/* Generate and bind VAO */
	gl.genVertexArrays(1, &m_vertex_array_object_id);
	gl.bindVertexArray(m_vertex_array_object_id);

	GLU_EXPECT_NO_ERROR(gl.getError(), "Could not create vertex array object");
}